

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryTestsUtil.cpp
# Opt level: O0

void vkt::geometry::checkGeometryShaderSupport
               (InstanceInterface *vki,VkPhysicalDevice physDevice,int numGeometryShaderInvocations)

{
  NotSupportedError *pNVar1;
  char *message;
  string local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  VkPhysicalDeviceProperties local_628;
  undefined1 local_2f0 [8];
  VkPhysicalDeviceLimits limits;
  VkPhysicalDeviceFeatures features;
  int numGeometryShaderInvocations_local;
  VkPhysicalDevice physDevice_local;
  InstanceInterface *vki_local;
  
  features.variableMultisampleRate = numGeometryShaderInvocations;
  unique0x100001b3 = physDevice;
  ::vk::getPhysicalDeviceFeatures
            ((VkPhysicalDeviceFeatures *)&limits.nonCoherentAtomSize,vki,physDevice);
  ::vk::getPhysicalDeviceProperties(&local_628,vki,stack0xffffffffffffffe8);
  memcpy(local_2f0,&local_628.limits,0x1f8);
  if (features.imageCubeArray == 0) {
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar1,"Missing feature: geometryShader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryTestsUtil.cpp"
               ,0x2d7);
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if ((features.variableMultisampleRate != 0) &&
     (limits.maxTessellationEvaluationInputComponents < features.variableMultisampleRate)) {
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_678,(int *)&features.variableMultisampleRate);
    std::operator+(&local_658,"Unsupported limit: maxGeometryShaderInvocations < ",&local_678);
    message = (char *)std::__cxx11::string::c_str();
    tcu::NotSupportedError::NotSupportedError
              (pNVar1,message,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryTestsUtil.cpp"
               ,0x2da);
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  return;
}

Assistant:

void checkGeometryShaderSupport (const InstanceInterface& vki, const VkPhysicalDevice physDevice, const int numGeometryShaderInvocations)
{
	const VkPhysicalDeviceFeatures	features	= getPhysicalDeviceFeatures  (vki, physDevice);
	const VkPhysicalDeviceLimits	limits		= getPhysicalDeviceProperties(vki, physDevice).limits;

	if (!features.geometryShader)
		TCU_THROW(NotSupportedError, "Missing feature: geometryShader");

	if (numGeometryShaderInvocations != 0 && limits.maxGeometryShaderInvocations < static_cast<deUint32>(numGeometryShaderInvocations))
		TCU_THROW(NotSupportedError, ("Unsupported limit: maxGeometryShaderInvocations < " + de::toString(numGeometryShaderInvocations)).c_str());
}